

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# view.cc
# Opt level: O2

void __thiscall gimage::View::setImage(View *this,ImageU8 *img)

{
  Camera *pCVar1;
  long lVar2;
  
  Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::operator=(&this->image,img);
  pCVar1 = this->camera;
  if (((pCVar1 != (Camera *)0x0) && (pCVar1->width == 0)) && (pCVar1->height == 0)) {
    lVar2 = (this->image).height;
    pCVar1->width = (this->image).width;
    pCVar1->height = lVar2;
  }
  return;
}

Assistant:

void View::setImage(const ImageU8 &img)
{
  image=img;

  // set size of camera from images if neccessary

  if (camera != 0 && camera->getWidth() == 0 && camera->getHeight() == 0)
  {
    camera->setSize(image.getWidth(), image.getHeight());
  }
}